

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * Strsafe_find(char *key)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  s_x1node *psVar4;
  
  iVar3 = 0;
  if (x1a != (s_x1 *)0x0) {
    cVar1 = *key;
    if (cVar1 != '\0') {
      pcVar2 = key + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)cVar1 + iVar3 * 0xd;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
    }
    for (psVar4 = x1a->ht[(long)iVar3 & (long)x1a->size - 1U]; psVar4 != (s_x1node *)0x0;
        psVar4 = psVar4->next) {
      pcVar2 = psVar4->data;
      iVar3 = strcmp(pcVar2,key);
      if (iVar3 == 0) {
        return pcVar2;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *Strsafe_find(const char *key)
{
  int h;
  x1node *np;

  if( x1a==0 ) return 0;
  h = strhash(key) & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}